

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateReturn(ExpressionTranslateContext *ctx,ExprReturn *expression)

{
  ExprBase *expression_00;
  TypeBase *pTVar1;
  ExpressionContext *pEVar2;
  ExprBase *pEVar3;
  char *pcVar4;
  bool bVar5;
  
  if (expression->coroutineStateUpdate != (ExprBase *)0x0) {
    Translate(ctx,expression->coroutineStateUpdate);
    Print(ctx,";");
    OutputContext::Print(ctx->output,"\n",1);
    PrintIndent(ctx);
  }
  expression_00 = expression->closures;
  if ((expression_00 == (ExprBase *)0x0) || (pEVar3 = expression_00, expression_00->typeID != 0x37))
  {
    pEVar3 = (ExprBase *)0x0;
  }
  if (pEVar3 == (ExprBase *)0x0) {
    bVar5 = true;
  }
  else {
    bVar5 = pEVar3[1].typeID == 0;
  }
  if (ctx->currentFunction == (FunctionData *)0x0) {
    if (!bVar5) {
      __assert_fail("!closures",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0x3cb,"void TranslateReturn(ExpressionTranslateContext &, ExprReturn *)");
    }
    pTVar1 = expression->value->type;
    pEVar2 = ctx->ctx;
    if ((((pTVar1 == pEVar2->typeBool) || (pTVar1 == pEVar2->typeChar)) ||
        (pTVar1 == pEVar2->typeShort)) || (pTVar1 == pEVar2->typeInt)) {
      pcVar4 = "__nullcOutputResultInt((int)(";
    }
    else if (pTVar1 == pEVar2->typeLong) {
      pcVar4 = "__nullcOutputResultLong((long long)(";
    }
    else {
      pcVar4 = "__nullcOutputResultDouble((double)(";
      if (((pTVar1 != pEVar2->typeFloat) && (pTVar1 != pEVar2->typeDouble)) &&
         ((pTVar1 == (TypeBase *)0x0 ||
          (pcVar4 = "__nullcOutputResultInt((int)(", pTVar1->typeID != 0x19)))) {
        __assert_fail("!\"unknown global return type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                      ,0x3d6,"void TranslateReturn(ExpressionTranslateContext &, ExprReturn *)");
      }
    }
    Print(ctx,pcVar4);
    Translate(ctx,expression->value);
    pTVar1 = expression->value->type;
    if ((pTVar1 != (TypeBase *)0x0) && (pTVar1->typeID == 0x19)) {
      Print(ctx,".value");
    }
    Print(ctx,"));");
    OutputContext::Print(ctx->output,"\n",1);
    PrintIndent(ctx);
    pcVar4 = "return 0;";
  }
  else if (expression->value->type == ctx->ctx->typeVoid) {
    if (!bVar5) {
      Translate(ctx,expression_00);
      Print(ctx,";");
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndent(ctx);
    }
    Translate(ctx,expression->value);
    Print(ctx,";");
    OutputContext::Print(ctx->output,"\n",1);
    PrintIndent(ctx);
    pcVar4 = "return;";
  }
  else {
    if (!bVar5) {
      Print(ctx,"__nullcReturnValue_%d = ",(ulong)ctx->nextReturnValueId);
      Translate(ctx,expression->value);
      Print(ctx,";");
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndent(ctx);
      Translate(ctx,expression->closures);
      Print(ctx,";");
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndent(ctx);
      Print(ctx,"return __nullcReturnValue_%d;",(ulong)ctx->nextReturnValueId);
      return;
    }
    Print(ctx,"return ");
    Translate(ctx,expression->value);
    pcVar4 = ";";
  }
  Print(ctx,pcVar4);
  return;
}

Assistant:

void TranslateReturn(ExpressionTranslateContext &ctx, ExprReturn *expression)
{
	if(expression->coroutineStateUpdate)
	{
		Translate(ctx, expression->coroutineStateUpdate);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);
	}

	ExprSequence *closures = getType<ExprSequence>(expression->closures);

	if(closures && closures->expressions.empty())
		closures = NULL;

	if(!ctx.currentFunction)
	{
		assert(!closures);

		if(expression->value->type == ctx.ctx.typeBool || expression->value->type == ctx.ctx.typeChar || expression->value->type == ctx.ctx.typeShort || expression->value->type == ctx.ctx.typeInt)
			Print(ctx, "__nullcOutputResultInt((int)(");
		else if(expression->value->type == ctx.ctx.typeLong)
			Print(ctx, "__nullcOutputResultLong((long long)(");
		else if(expression->value->type == ctx.ctx.typeFloat || expression->value->type == ctx.ctx.typeDouble)
			Print(ctx, "__nullcOutputResultDouble((double)(");
		else if(isType<TypeEnum>(expression->value->type))
			Print(ctx, "__nullcOutputResultInt((int)(");
		else
			assert(!"unknown global return type");

		Translate(ctx, expression->value);

		if(isType<TypeEnum>(expression->value->type))
			Print(ctx, ".value");

		Print(ctx, "));");
		PrintLine(ctx);
		PrintIndent(ctx);

		Print(ctx, "return 0;");
	}
	else
	{
		if(expression->value->type == ctx.ctx.typeVoid)
		{
			if(closures)
			{
				Translate(ctx, expression->closures);
				Print(ctx, ";");
				PrintLine(ctx);
				PrintIndent(ctx);
			}

			Translate(ctx, expression->value);
			Print(ctx, ";");
			PrintLine(ctx);
			PrintIndent(ctx);

			Print(ctx, "return;");
		}
		else if(closures)
		{
			Print(ctx, "__nullcReturnValue_%d = ", ctx.nextReturnValueId);
			Translate(ctx, expression->value);
			Print(ctx, ";");
			PrintLine(ctx);
			PrintIndent(ctx);

			Translate(ctx, expression->closures);
			Print(ctx, ";");
			PrintLine(ctx);
			PrintIndent(ctx);

			Print(ctx, "return __nullcReturnValue_%d;", ctx.nextReturnValueId);
		}
		else
		{
			Print(ctx, "return ");
			Translate(ctx, expression->value);
			Print(ctx, ";");
		}
	}
}